

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFG.h
# Opt level: O0

void __thiscall covenant::CFGConnect::cleanup(CFGConnect *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  
  std::vector<covenant::CFGConnect::VertInfo,_std::allocator<covenant::CFGConnect::VertInfo>_>::
  clear((vector<covenant::CFGConnect::VertInfo,_std::allocator<covenant::CFGConnect::VertInfo>_> *)
        0x221ebc);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::clear((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           *)0x221eca);
  while( true ) {
    bVar1 = std::stack<int,_std::deque<int,_std::allocator<int>_>_>::empty
                      ((stack<int,_std::deque<int,_std::allocator<int>_>_> *)0x221ed8);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    std::stack<int,_std::deque<int,_std::allocator<int>_>_>::pop
              ((stack<int,_std::deque<int,_std::allocator<int>_>_> *)0x221eee);
  }
  return;
}

Assistant:

void cleanup(){
      verts.clear();
      groups.clear();
      while (!S.empty()) { S.pop(); }
    }